

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeNode.h
# Opt level: O1

TreeNode<ObservationHistory> * __thiscall
TreeNode<ObservationHistory>::GetSuccessor(TreeNode<ObservationHistory> *this,LIndex sucI)

{
  _Rb_tree_header *p_Var1;
  mapped_type *ppTVar2;
  EInvalidIndex *this_00;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  LIndex local_18;
  
  p_Var1 = &(this->_m_successor)._M_t._M_impl.super__Rb_tree_header;
  p_Var4 = (this->_m_successor)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var3 = &p_Var1->_M_header;
  for (; p_Var4 != (_Base_ptr)0x0; p_Var4 = (&p_Var4->_M_left)[*(ulong *)(p_Var4 + 1) < sucI]) {
    if (*(ulong *)(p_Var4 + 1) >= sucI) {
      p_Var3 = p_Var4;
    }
  }
  p_Var4 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var3 != p_Var1) && (p_Var4 = p_Var3, sucI < *(ulong *)(p_Var3 + 1))) {
    p_Var4 = &p_Var1->_M_header;
  }
  local_18 = sucI;
  if ((_Rb_tree_header *)p_Var4 != p_Var1) {
    ppTVar2 = std::
              map<unsigned_long_long,_TreeNode<ObservationHistory>_*,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_TreeNode<ObservationHistory>_*>_>_>
              ::operator[](&this->_m_successor,&local_18);
    return *ppTVar2;
  }
  this_00 = (EInvalidIndex *)__cxa_allocate_exception(0x28);
  EInvalidIndex::EInvalidIndex(this_00,"TreeNode::GetSuccessor successor not found");
  __cxa_throw(this_00,&EInvalidIndex::typeinfo,E::~E);
}

Assistant:

TreeNode<Tcontained>* TreeNode<Tcontained>::GetSuccessor(LIndex sucI)
{
    if(_m_successor.find(sucI)==_m_successor.end())
        throw EInvalidIndex("TreeNode::GetSuccessor successor not found");
    else
        return(_m_successor[sucI]);
}